

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe46At1(uint8_t *buf)

{
  return (ulong)((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 0x7f) << 0x10) << 0x17 |
         (ulong)((uint)buf[4] << 7 | (uint)buf[3] << 0xf) | (ulong)(buf[5] >> 1);
}

Assistant:

std::uint64_t readFlUIntBe46At1(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 7;
    res |= (buf[5] >> 1);
    res &= UINT64_C(0x3fffffffffff);
    return res;
}